

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetDataReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::SetDataReliablePdu::SetDataReliablePdu(SetDataReliablePdu *this)

{
  SetDataReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu.super_PduSuperclass.
  _vptr_PduSuperclass = (_func_int **)&PTR__SetDataReliablePdu_00268f68;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_requestID = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::vector(&this->_fixedDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_variableDatumRecords);
  PduSuperclass::setPduType((PduSuperclass *)this,';');
  return;
}

Assistant:

SetDataReliablePdu::SetDataReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _requestID(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 59 );
}